

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isNearestSampleResultValid<tcu::IntLookupPrecision,int>
               (ConstPixelBufferAccess *level,Sampler *sampler,IntLookupPrecision *prec,float coordX
               ,int coordY,Vector<int,_4> *result)

{
  WrapMode mode;
  bool bVar1;
  int iVar2;
  int iVar3;
  int uvBits;
  deInt32 dVar4;
  deInt32 dVar5;
  float fVar6;
  undefined1 local_60 [8];
  Vector<int,_4> color;
  int x;
  int i;
  int maxI;
  int minI;
  Vec2 uBounds;
  Vector<int,_4> *result_local;
  int coordY_local;
  float coordX_local;
  IntLookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  bVar1 = sampler->normalizedCoords;
  uBounds.m_data = (float  [2])result;
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  iVar3 = Vector<int,_3>::x(&prec->coordBits);
  uvBits = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar1 & 1),iVar2,coordX,iVar3,uvBits);
  fVar6 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  dVar4 = ::deFloorFloatToInt32(fVar6);
  fVar6 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar5 = ::deFloorFloatToInt32(fVar6);
  color.m_data[3] = dVar4;
  while( true ) {
    iVar2 = color.m_data[3];
    if (dVar5 < color.m_data[3]) {
      return false;
    }
    mode = sampler->wrapS;
    iVar3 = ConstPixelBufferAccess::getWidth(level);
    color.m_data[2] = TexVerifierUtil::wrap(mode,iVar2,iVar3);
    lookup<int>((tcu *)local_60,level,sampler,color.m_data[2],coordY,0);
    bVar1 = isColorValid(prec,(IVec4 *)local_60,(IVec4 *)uBounds.m_data);
    if (bVar1) break;
    color.m_data[3] = color.m_data[3] + 1;
  }
  return true;
}

Assistant:

static bool isNearestSampleResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const PrecType&						prec,
										const float							coordX,
										const int							coordY,
										const Vector<ScalarType, 4>&		result)
{
	DE_ASSERT(level.getDepth() == 1);

	const Vec2		uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coordX, prec.coordBits.x(), prec.uvwBits.x());

	const int		minI			= deFloorFloatToInt32(uBounds.x());
	const int		maxI			= deFloorFloatToInt32(uBounds.y());

	for (int i = minI; i <= maxI; i++)
	{
		const int					x		= wrap(sampler.wrapS, i, level.getWidth());
		const Vector<ScalarType, 4>	color	= lookup<ScalarType>(level, sampler, x, coordY, 0);

		if (isColorValid(prec, color, result))
			return true;
	}

	return false;
}